

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<bool,unsigned_long>
          (BaseAppender *this,Vector *col,bool input)

{
  bool bVar1;
  InvalidInputException *this_00;
  bool input_00;
  unsigned_long result;
  uint64_t local_40;
  string local_38;
  
  bVar1 = TryCast::Operation<bool,unsigned_long>(input,&local_40,false);
  if (bVar1) {
    *(uint64_t *)(col->data + (this->chunk).count * 8) = local_40;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<bool,unsigned_long>(&local_38,(duckdb *)(ulong)input,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}